

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O0

void __thiscall
oout::dirty::Test::
Test<std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>>
          (Test *this,string *name,shared_ptr<oout::NamedTest> *tests,
          shared_ptr<oout::NamedTest> *tests_1,shared_ptr<oout::NamedTest> *tests_2)

{
  undefined1 local_50 [16];
  shared_ptr<const_oout::Test> local_40;
  shared_ptr<oout::NamedTest> *local_30;
  shared_ptr<oout::NamedTest> *tests_local_2;
  shared_ptr<oout::NamedTest> *tests_local_1;
  shared_ptr<oout::NamedTest> *tests_local;
  string *name_local;
  Test *this_local;
  
  local_30 = tests_2;
  tests_local_2 = tests_1;
  tests_local_1 = tests;
  tests_local = (shared_ptr<oout::NamedTest> *)name;
  name_local = (string *)this;
  std::
  make_shared<oout::NamedTest,std::__cxx11::string_const&,std::shared_ptr<oout::NamedTest>const&,std::shared_ptr<oout::NamedTest>const&,std::shared_ptr<oout::NamedTest>const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (shared_ptr<oout::NamedTest> *)name,tests,tests_1);
  std::shared_ptr<oout::Test_const>::shared_ptr<oout::NamedTest,void>
            ((shared_ptr<oout::Test_const> *)&local_40,(shared_ptr<oout::NamedTest> *)local_50);
  Test(this,&local_40);
  std::shared_ptr<const_oout::Test>::~shared_ptr(&local_40);
  std::shared_ptr<oout::NamedTest>::~shared_ptr((shared_ptr<oout::NamedTest> *)local_50);
  return;
}

Assistant:

Test(
		const std::string &name,
		const T & ... tests
	) : Test(std::make_shared<oout::NamedTest>(name, tests...))
	{
	}